

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  Curl_easy *data_00;
  CURLcode CVar1;
  char *pcVar2;
  char *local_80;
  char *local_78;
  char *local_70;
  Curl_easy *data;
  char *pcStack_40;
  CURLcode result;
  char *auth;
  _Bool proxy_local;
  char *path_local;
  char *request_local;
  auth *authstatus_local;
  connectdata *conn_local;
  
  pcStack_40 = (char *)0x0;
  data_00 = conn->data;
  if (authstatus->picked == 8) {
    pcStack_40 = "NTLM";
    CVar1 = Curl_output_ntlm(conn,proxy);
  }
  else {
    if (authstatus->picked != 2) {
      if (authstatus->picked == 1) {
        if ((((proxy) && (((conn->bits).proxy_user_passwd & 1U) != 0)) &&
            (pcVar2 = Curl_checkProxyheaders(conn,"Proxy-authorization"), pcVar2 == (char *)0x0)) ||
           (((!proxy && (((conn->bits).user_passwd & 1U) != 0)) &&
            (pcVar2 = Curl_checkheaders(conn,"Authorization"), pcVar2 == (char *)0x0)))) {
          pcStack_40 = "Basic";
          CVar1 = http_output_basic(conn,proxy);
          if (CVar1 != CURLE_OK) {
            return CVar1;
          }
        }
        authstatus->done = true;
      }
      goto LAB_00116804;
    }
    pcStack_40 = "Digest";
    CVar1 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
  }
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
LAB_00116804:
  if (pcStack_40 == (char *)0x0) {
    authstatus->multipass = false;
  }
  else {
    pcVar2 = "Server";
    if (proxy) {
      pcVar2 = "Proxy";
      if ((conn->http_proxy).user == (char *)0x0) {
        local_70 = "";
      }
      else {
        local_70 = (conn->http_proxy).user;
      }
      local_78 = local_70;
    }
    else {
      if (conn->user == (char *)0x0) {
        local_80 = "";
      }
      else {
        local_80 = conn->user;
      }
      local_78 = local_80;
    }
    Curl_infof(data_00,"%s auth using %s with user \'%s\'\n",pcVar2,pcStack_40,local_78);
    authstatus->multipass = ((authstatus->done ^ 0xffU) & 1) != 0;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS) || defined(USE_SPNEGO)
  struct Curl_easy *data = conn->data;
#endif
#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy ?
    &data->state.proxyneg : &data->state.negotiate;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  negdata->state = GSS_AUTHNONE;
  if((authstatus->picked == CURLAUTH_NEGOTIATE) &&
     negdata->context && !GSS_ERROR(negdata->status)) {
    auth = "Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
    authstatus->done = TRUE;
    negdata->state = GSS_AUTHSENT;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (conn->http_proxy.user ? conn->http_proxy.user : "") :
                  (conn->user ? conn->user : ""));
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}